

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deThreadTest.c
# Opt level: O1

void deMutex_selfTest(void)

{
  deBool dVar1;
  deMutex dVar2;
  deThread dVar3;
  int iVar4;
  long lVar5;
  deMutex mutex;
  deThread threads [2];
  deMutex local_60;
  undefined8 local_58;
  int local_50;
  deThread adStack_48 [3];
  
  dVar2 = deMutex_create((deMutexAttributes *)0x0);
  if (dVar2 == 0) {
    deAssertFail("mutex",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0xee);
  }
  deMutex_lock(dVar2);
  deMutex_unlock(dVar2);
  dVar1 = deMutex_tryLock(dVar2);
  if (dVar1 == 0) {
    deAssertFail("ret",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0xf5);
  }
  deMutex_unlock(dVar2);
  deMutex_destroy(dVar2);
  local_60 = CONCAT44(local_60._4_4_,1);
  dVar2 = deMutex_create((deMutexAttributes *)&local_60);
  if (dVar2 == 0) {
    deAssertFail("mutex",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x107);
  }
  iVar4 = 10;
  do {
    deMutex_lock(dVar2);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  iVar4 = 10;
  do {
    deMutex_unlock(dVar2);
    iVar4 = iVar4 + -1;
  } while (iVar4 != 0);
  deMutex_destroy(dVar2);
  local_60 = deMutex_create((deMutexAttributes *)0x0);
  if (local_60 == 0) {
    deAssertFail("mutex",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x118);
  }
  deMutex_lock(local_60);
  dVar3 = deThread_create(mutexTestThr1,&local_60,(deThreadAttributes *)0x0);
  if (dVar3 == 0) {
    deAssertFail("thread",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x11d);
  }
  deSleep(100);
  deMutex_unlock(local_60);
  deMutex_lock(local_60);
  deMutex_unlock(local_60);
  deThread_join(dVar3);
  deThread_destroy(dVar3);
  deMutex_destroy(local_60);
  local_60 = deMutex_create((deMutexAttributes *)0x0);
  if (local_60 == 0) {
    deAssertFail("data.mutex",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x132);
  }
  local_58 = 0;
  local_50 = 1000;
  deMutex_lock(local_60);
  lVar5 = 0;
  do {
    dVar3 = deThread_create(mutexTestThr2,&local_60,(deThreadAttributes *)0x0);
    adStack_48[lVar5] = dVar3;
    if (dVar3 == 0) {
      deAssertFail("threads[ndx]",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0x13d);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 == 1);
  deMutex_unlock(local_60);
  lVar5 = 0;
  do {
    dVar3 = adStack_48[lVar5];
    dVar1 = deThread_join(dVar3);
    if (dVar1 == 0) {
      deAssertFail("ret",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                   ,0x145);
    }
    deThread_destroy(dVar3);
    lVar5 = lVar5 + 1;
  } while (lVar5 == 1);
  if ((int)local_58 != local_58._4_4_) {
    deAssertFail("data.counter == data.counter2",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x149);
  }
  if (local_50 != (int)local_58) {
    deAssertFail("data.maxVal == data.counter",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x14a);
  }
  deMutex_destroy(local_60);
  local_60 = deMutex_create((deMutexAttributes *)0x0);
  if (local_60 == 0) {
    deAssertFail("mutex",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x154);
  }
  deMutex_lock(local_60);
  dVar3 = deThread_create(mutexTestThr3,&local_60,(deThreadAttributes *)0x0);
  if (local_60 == 0) {
    deAssertFail("mutex",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x159);
  }
  dVar1 = deThread_join(dVar3);
  if (dVar1 == 0) {
    deAssertFail("ret",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/delibs/dethread/deThreadTest.c"
                 ,0x15c);
  }
  deMutex_unlock(local_60);
  deMutex_destroy(local_60);
  deThread_destroy(dVar3);
  return;
}

Assistant:

void deMutex_selfTest (void)
{
	/* Default mutex from single thread. */
	{
		deMutex mutex = deMutex_create(DE_NULL);
		deBool	ret;
		DE_TEST_ASSERT(mutex);

		deMutex_lock(mutex);
		deMutex_unlock(mutex);

		/* Should succeed. */
		ret = deMutex_tryLock(mutex);
		DE_TEST_ASSERT(ret);
		deMutex_unlock(mutex);

		deMutex_destroy(mutex);
	}

	/* Recursive mutex. */
	{
		deMutexAttributes	attrs;
		deMutex				mutex;
		int					ndx;
		int					numLocks	= 10;

		deMemset(&attrs, 0, sizeof(attrs));

		attrs.flags = DE_MUTEX_RECURSIVE;

		mutex = deMutex_create(&attrs);
		DE_TEST_ASSERT(mutex);

		for (ndx = 0; ndx < numLocks; ndx++)
			deMutex_lock(mutex);

		for (ndx = 0; ndx < numLocks; ndx++)
			deMutex_unlock(mutex);

		deMutex_destroy(mutex);
	}

	/* Mutex and threads. */
	{
		deMutex		mutex;
		deThread	thread;

		mutex = deMutex_create(DE_NULL);
		DE_TEST_ASSERT(mutex);

		deMutex_lock(mutex);

		thread = deThread_create(mutexTestThr1, &mutex, DE_NULL);
		DE_TEST_ASSERT(thread);

		deSleep(100);
		deMutex_unlock(mutex);

		deMutex_lock(mutex);
		deMutex_unlock(mutex);

		deThread_join(thread);

		deThread_destroy(thread);
		deMutex_destroy(mutex);
	}

	/* A bit more complex mutex test. */
	{
		MutexData2	data;
		deThread	threads[2];
		int			ndx;

		data.mutex	= deMutex_create(DE_NULL);
		DE_TEST_ASSERT(data.mutex);

		data.counter	= 0;
		data.counter2	= 0;
		data.maxVal		= 1000;

		deMutex_lock(data.mutex);

		for (ndx = 0; ndx < (int)DE_LENGTH_OF_ARRAY(threads); ndx++)
		{
			threads[ndx] = deThread_create(mutexTestThr2, &data, DE_NULL);
			DE_TEST_ASSERT(threads[ndx]);
		}

		deMutex_unlock(data.mutex);

		for (ndx = 0; ndx < (int)DE_LENGTH_OF_ARRAY(threads); ndx++)
		{
			deBool ret = deThread_join(threads[ndx]);
			DE_TEST_ASSERT(ret);
			deThread_destroy(threads[ndx]);
		}

		DE_TEST_ASSERT(data.counter == data.counter2);
		DE_TEST_ASSERT(data.maxVal == data.counter);

		deMutex_destroy(data.mutex);
	}

	/* tryLock() deadlock test. */
	{
		deThread	thread;
		deMutex		mutex	= deMutex_create(DE_NULL);
		deBool		ret;
		DE_TEST_ASSERT(mutex);

		deMutex_lock(mutex);

		thread = deThread_create(mutexTestThr3, &mutex, DE_NULL);
		DE_TEST_ASSERT(mutex);

		ret = deThread_join(thread);
		DE_TEST_ASSERT(ret);

		deMutex_unlock(mutex);
		deMutex_destroy(mutex);
		deThread_destroy(thread);
	}
}